

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassembly.c
# Opt level: O3

la_reasm_table * la_reasm_table_lookup(la_reasm_ctx *rctx,void *table_id)

{
  la_list *l;
  
  l = rctx->rtables;
  while( true ) {
    if (l == (la_list *)0x0) {
      return (la_reasm_table *)0x0;
    }
    if (((la_reasm_table *)l->data)->key == table_id) break;
    l = la_list_next(l);
  }
  return (la_reasm_table *)l->data;
}

Assistant:

la_reasm_table *la_reasm_table_lookup(la_reasm_ctx *rctx, void const *table_id) {
	la_assert(rctx != NULL);
	la_assert(table_id != NULL);

	for(la_list *l = rctx->rtables; l != NULL; l = la_list_next(l)) {
		la_reasm_table *rt = l->data;
		if(rt->key == table_id) {
			return rt;
		}
	}
	return NULL;
}